

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O3

void nni_http_transact_conn(nni_http_conn *conn,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *aio_00;
  nni_list_node *res;
  
  nni_aio_reset(aio);
  aio_00 = (nni_aio *)nni_zalloc(0x210);
  if (aio_00 == (nni_aio *)0x0) {
    nni_aio_finish_error(aio,NNG_ENOMEM);
    return;
  }
  nni_aio_init(aio_00,http_txn_cb,aio_00);
  nni_aio_list_init((nni_list *)(aio_00 + 1));
  aio_00[1].a_stop = false;
  aio_00[1].a_sleep = false;
  aio_00[1].a_expire_ok = false;
  aio_00[1].a_expiring = false;
  aio_00[1].a_use_expire = false;
  aio_00[1].a_abort = false;
  aio_00[1].a_init = false;
  aio_00[1].a_stopped = false;
  aio_00[1].a_task.task_node.ln_next = (nni_list_node *)conn;
  res = (nni_list_node *)nni_http_conn_res(conn);
  aio_00[1].a_task.task_node.ln_prev = res;
  *(undefined4 *)&aio_00[1].a_task.task_cb = 0;
  nni_http_res_reset((nni_http_res *)res);
  nni_http_set_status((nng_http *)aio_00[1].a_task.task_node.ln_next,0,(char *)0x0);
  nni_mtx_lock(&http_txn_lk);
  _Var1 = nni_aio_start(aio,http_txn_cancel,aio_00);
  if (_Var1) {
    nni_list_append((nni_list *)(aio_00 + 1),aio);
    nni_http_write_req(conn,aio_00);
    nni_mtx_unlock(&http_txn_lk);
    return;
  }
  nni_mtx_unlock(&http_txn_lk);
  nni_reap(&http_txn_reaplist,aio_00);
  return;
}

Assistant:

void
nni_http_transact_conn(nni_http_conn *conn, nni_aio *aio)
{
	http_txn *txn;

	nni_aio_reset(aio);
	if ((txn = NNI_ALLOC_STRUCT(txn)) == NULL) {
		nni_aio_finish_error(aio, NNG_ENOMEM);
		return;
	}
	nni_aio_init(&txn->aio, http_txn_cb, txn);
	nni_aio_list_init(&txn->aios);
	txn->client = NULL;
	txn->conn   = conn;
	txn->res    = nni_http_conn_res(conn);
	txn->state  = HTTP_SENDING;

	nni_http_res_reset(txn->res);
	nni_http_set_status(txn->conn, 0, NULL);

	nni_mtx_lock(&http_txn_lk);
	if (!nni_aio_start(aio, http_txn_cancel, txn)) {
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;
	}
	nni_list_append(&txn->aios, aio);
	nni_http_write_req(conn, &txn->aio);
	nni_mtx_unlock(&http_txn_lk);
}